

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_variables(CompilerHLSL *this)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  __node_base *p_Var5;
  bool need_base_vertex_info;
  Bitset builtins;
  bool local_b1;
  SmallVector<unsigned_int,_8UL> local_b0;
  anon_class_16_2_7737ed71 local_78;
  Bitset local_68;
  
  Bitset::Bitset(&local_68,&(this->super_CompilerGLSL).super_Compiler.active_input_builtins);
  Bitset::merge_or(&local_68,&(this->super_CompilerGLSL).super_Compiler.active_output_builtins);
  local_78.need_base_vertex_info = &local_b1;
  local_b1 = false;
  local_78.this = this;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if ((local_68.lower >> (uVar4 & 0x3f) & 1) != 0) {
      emit_builtin_variables::anon_class_16_2_7737ed71::operator()(&local_78,(uint32_t)uVar4);
    }
  }
  if (local_68.higher._M_h._M_element_count != 0) {
    local_b0.super_VectorView<unsigned_int>.ptr = (uint *)&local_b0.stack_storage;
    local_b0.super_VectorView<unsigned_int>.buffer_size = 0;
    local_b0.buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve(&local_b0,local_68.higher._M_h._M_element_count);
    p_Var5 = &local_68.higher._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      SmallVector<unsigned_int,_8UL>::push_back(&local_b0,(uint *)(p_Var5 + 1));
    }
    ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b0.super_VectorView<unsigned_int>.ptr,
               (char *)local_b0.super_VectorView<unsigned_int>.ptr +
               local_b0.super_VectorView<unsigned_int>.buffer_size * 4);
    puVar1 = local_b0.super_VectorView<unsigned_int>.ptr;
    lVar2 = local_b0.super_VectorView<unsigned_int>.buffer_size << 2;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 4) {
      emit_builtin_variables::anon_class_16_2_7737ed71::operator()
                (&local_78,*(uint32_t *)((char *)puVar1 + lVar3));
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&local_b0);
  }
  if (local_b1 == true) {
    CompilerGLSL::statement<char_const(&)[31]>
              (&this->super_CompilerGLSL,(char (*) [31])"cbuffer SPIRV_Cross_VertexInfo");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[28]>(&this->super_CompilerGLSL,(char (*) [28])0x30b74a);
    CompilerGLSL::statement<char_const(&)[30]>(&this->super_CompilerGLSL,(char (*) [30])0x30b6f4);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68.higher._M_h);
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_variables()
{
	Bitset builtins = active_input_builtins;
	builtins.merge_or(active_output_builtins);

	bool need_base_vertex_info = false;

	// Emit global variables for the interface variables which are statically used by the shader.
	builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		uint32_t array_size = 0;

		switch (builtin)
		{
		case BuiltInFragCoord:
		case BuiltInPosition:
			type = "float4";
			break;

		case BuiltInFragDepth:
			type = "float";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			type = "int";
			if (hlsl_options.support_nonzero_base_vertex_base_instance)
				need_base_vertex_info = true;
			break;

		case BuiltInInstanceId:
		case BuiltInSampleId:
			type = "int";
			break;

		case BuiltInPointSize:
			if (hlsl_options.point_size_compat)
			{
				// Just emit the global variable, it will be ignored.
				type = "float";
				break;
			}
			else
				SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));

		case BuiltInGlobalInvocationId:
		case BuiltInLocalInvocationId:
		case BuiltInWorkgroupId:
			type = "uint3";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
			// Handled specially.
			break;

		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupSize:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			break;

		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			type = "uint4";
			break;

		case BuiltInClipDistance:
			array_size = clip_distance_count;
			type = "float";
			break;

		case BuiltInCullDistance:
			array_size = cull_distance_count;
			type = "float";
			break;

		case BuiltInSampleMask:
			type = "int";
			break;

		default:
			SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));
		}

		StorageClass storage = active_input_builtins.get(i) ? StorageClassInput : StorageClassOutput;

		if (type)
		{
			if (array_size)
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), "[", array_size, "];");
			else
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), ";");
		}

		// SampleMask can be both in and out with sample builtin, in this case we have already
		// declared the input variable and we need to add the output one now.
		if (builtin == BuiltInSampleMask && storage == StorageClassInput && this->active_output_builtins.get(i))
		{
			statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), ";");
		}
	});

	if (need_base_vertex_info)
	{
		statement("cbuffer SPIRV_Cross_VertexInfo");
		begin_scope();
		statement("int SPIRV_Cross_BaseVertex;");
		statement("int SPIRV_Cross_BaseInstance;");
		end_scope_decl();
		statement("");
	}
}